

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O3

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,FieldInvocation *ptr)

{
  pointer ppVVar1;
  string *psVar2;
  size_t __n;
  VariableSymbol *pVVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer ppVVar5;
  
  ppVVar5 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar5 != ppVVar1) {
    psVar2 = ptr->name;
    __n = psVar2->_M_string_length;
    do {
      pVVar3 = *ppVVar5;
      if ((pVVar3->super_BaseSymbol).name._M_string_length == __n) {
        if (__n == 0) {
LAB_0011df28:
          ptr->type = pVVar3->type;
          return;
        }
        iVar4 = bcmp((pVVar3->super_BaseSymbol).name._M_dataplus._M_p,(psVar2->_M_dataplus)._M_p,__n
                    );
        if (iVar4 == 0) goto LAB_0011df28;
      }
      ppVVar5 = ppVVar5 + 1;
    } while (ppVVar5 != ppVVar1);
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"syntax error: can\'t find field ",ptr->name);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::visit(FieldInvocation* ptr) {
    bool field_exists = false;
    for(auto field : curr_class->fields) {
        if (field->name == *ptr->name) {
            field_exists = true;
            ptr->type = field->type;
            break;
        }
    }
    if (!field_exists) {
        throw "syntax error: can't find field " + *ptr->name;
    }
    //name
}